

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

int gflags::main(int argc,char **argv)

{
  char *pcVar1;
  int local_e8;
  allocator local_e1;
  int exit_status;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string usage_message;
  char *pcStack_48;
  char *test_argv [4];
  char **ppcStack_18;
  bool run_tests;
  char **argv_local;
  int argc_local;
  
  test_argv[1] = "3rd argv";
  test_argv[2] = "argv #4";
  pcStack_48 = "/test/argv/for/gflags_unittest";
  test_argv[0] = "argv 2";
  ppcStack_18 = argv;
  argv_local._4_4_ = argc;
  SetArgv(4,&pcStack_48);
  pcVar1 = GetArgv0();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_89);
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::operator=(fLS::FLAGS_tryfromenv_abi_cxx11_,"test_tryfromenv");
  setenv("FLAGS_test_tryfromenv","pre-set",1);
  SetCommandLineOptionWithMode_abi_cxx11_((char *)local_c0,"changed_bool1",0x1779dc);
  std::__cxx11::string::~string(local_c0);
  fLB::FLAGS_changed_bool2 = 1;
  SetUsageMessage(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&exit_status,"test_version",&local_e1);
  SetVersionString((string *)&exit_status);
  std::__cxx11::string::~string((string *)&exit_status);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  ParseCommandLineFlags((int *)((long)&argv_local + 4),&stack0xffffffffffffffe8,true);
  MakeTmpdir(fLS::FLAGS_test_tmpdir_abi_cxx11_);
  local_e8 = 0;
  if (argc == 1) {
    fprintf(_stdout,"Running the unit tests now...\n\n");
    fflush(_stdout);
    local_e8 = RUN_ALL_TESTS();
  }
  else {
    fprintf(_stderr,"\n\nPASS\n");
  }
  ShutDownCommandLineFlags();
  std::__cxx11::string::~string((string *)local_68);
  return local_e8;
}

Assistant:

static int main(int argc, char **argv) {

  // Run unit tests only if called without arguments, otherwise this program
  // is used by an "external" usage test
  const bool run_tests = (argc == 1);

  // We need to call SetArgv before parsing flags, so our "test" argv will
  // win out over this executable's real argv.  That makes running this
  // test with a real --help flag kinda annoying, unfortunately.
  const char* test_argv[] = { "/test/argv/for/gflags_unittest",
                              "argv 2", "3rd argv", "argv #4" };
  SetArgv(arraysize(test_argv), test_argv);

  // The first arg is the usage message, also important for testing.
  string usage_message = (string(GetArgv0()) +
                          ": <useless flag> [...]\nDoes something useless.\n");

  // We test setting tryfromenv manually, and making sure
  // ParseCommandLineFlags still evaluates it.
  FLAGS_tryfromenv = "test_tryfromenv";
  setenv("FLAGS_test_tryfromenv", "pre-set", 1);

  // Modify flag values from declared default value in two ways.
  // The recommended way:
  SetCommandLineOptionWithMode("changed_bool1", "true", SET_FLAGS_DEFAULT);

  // The non-recommended way:
  FLAGS_changed_bool2 = true;

  SetUsageMessage(usage_message);
  SetVersionString("test_version");
  ParseCommandLineFlags(&argc, &argv, true);
  MakeTmpdir(&FLAGS_test_tmpdir);

  int exit_status = 0;
  if (run_tests) {
	  fprintf(stdout, "Running the unit tests now...\n\n"); fflush(stdout);
	  exit_status = RUN_ALL_TESTS();
  } else fprintf(stderr, "\n\nPASS\n");
  ShutDownCommandLineFlags();
  return exit_status;
}